

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

AActor * __thiscall FBlockThingsIterator::Next(FBlockThingsIterator *this,bool centeronly)

{
  TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry> *this_00;
  double dVar1;
  int iVar2;
  int iVar3;
  AActor *pAVar4;
  FBlockNode *pFVar5;
  uint uVar6;
  long lVar7;
  HashEntry *pHVar8;
  int y;
  int *piVar9;
  int x;
  FBlockNode *pFVar10;
  int *piVar11;
  HashEntry *pHVar12;
  double blockleft;
  double dVar13;
  double dVar14;
  
  this_00 = &this->DynHash;
  do {
    pHVar8 = (this->DynHash).Array;
    iVar2 = this->curx;
    iVar3 = this->cury;
    dVar13 = (double)(iVar2 << 7) + bmaporgx;
    dVar14 = (double)(iVar3 << 7) + bmaporgy;
    pFVar10 = this->block;
    while (pFVar10 != (FBlockNode *)0x0) {
      pAVar4 = pFVar10->Me;
      pFVar5 = pFVar10->NextActor;
      this->block = pFVar5;
      if ((pFVar10->NextBlock == (FBlockNode *)0x0) && (pFVar10->PrevBlock == &pAVar4->BlockNode)) {
        return pAVar4;
      }
      pFVar10 = pFVar5;
      if (centeronly) {
        dVar1 = (pAVar4->__Pos).X;
        if ((((dVar13 <= dVar1) && (dVar1 < dVar13 + 128.0)) &&
            (dVar1 = (pAVar4->__Pos).Y, dVar14 <= dVar1)) && (dVar1 < dVar14 + 128.0)) {
          return pAVar4;
        }
      }
      else {
        piVar9 = (int *)((long)this->Buckets + (ulong)((uint)((ulong)pAVar4 >> 1) & 0x7c));
        piVar11 = piVar9;
        do {
          uVar6 = *piVar11;
          if ((long)(int)uVar6 < 0) {
            uVar6 = this->NumFixedHash;
            lVar7 = (long)(int)uVar6;
            if (lVar7 < 10) {
              pHVar8 = this->FixedHash + lVar7;
              this->FixedHash[lVar7].Next = *piVar9;
              this->NumFixedHash = uVar6 + 1;
            }
            else {
              if ((this->DynHash).Count == 0) {
                TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::Grow
                          (this_00,0x32);
              }
              uVar6 = TArray<FBlockThingsIterator::HashEntry,_FBlockThingsIterator::HashEntry>::
                      Reserve(this_00,1);
              pHVar8 = this_00->Array + (int)uVar6;
              this_00->Array[(int)uVar6].Next = *piVar9;
              uVar6 = uVar6 + 10;
            }
            *piVar9 = uVar6;
            pHVar8->Actor = pAVar4;
            return pAVar4;
          }
          pHVar12 = pHVar8 + -10;
          if (uVar6 < 10) {
            pHVar12 = this->FixedHash;
          }
          piVar11 = &pHVar12[(int)uVar6].Next;
        } while (pHVar12[(int)uVar6].Actor != pAVar4);
      }
    }
    x = iVar2 + 1;
    this->curx = x;
    y = iVar3;
    if (this->maxx <= iVar2) {
      x = this->minx;
      this->curx = x;
      y = iVar3 + 1;
      this->cury = y;
      if (this->maxy <= iVar3) {
        return (AActor *)0x0;
      }
    }
    StartBlock(this,x,y);
  } while( true );
}

Assistant:

AActor *FBlockThingsIterator::Next(bool centeronly)
{
	for (;;)
	{
		while (block != NULL)
		{
			AActor *me = block->Me;
			FBlockNode *mynode = block;
			HashEntry *entry;
			int i;

			block = block->NextActor;
			// Don't recheck things that were already checked
			if (mynode->NextBlock == NULL && mynode->PrevBlock == &me->BlockNode)
			{ // This actor doesn't span blocks, so we know it can only ever be checked once.
				return me;
			}
			if (centeronly)
			{
				// Block boundaries for compatibility mode
				double blockleft = (curx * MAPBLOCKUNITS) + bmaporgx;
				double blockright = blockleft + MAPBLOCKUNITS;
				double blockbottom = (cury * MAPBLOCKUNITS) + bmaporgy;
				double blocktop = blockbottom + MAPBLOCKUNITS;

				// only return actors with the center in this block
				if (me->X() >= blockleft && me->X() < blockright &&
					me->Y() >= blockbottom && me->Y() < blocktop)
				{
					return me;
				}
			}
			else
			{
				size_t hash = ((size_t)me >> 3) % countof(Buckets);
				for (i = Buckets[hash]; i >= 0; )
				{
					entry = GetHashEntry(i);
					if (entry->Actor == me)
					{ // I've already been checked. Skip to the next actor.
						break;
					}
					i = entry->Next;
				}
				if (i < 0)
				{ // Add me to the hash table and return me.
					if (NumFixedHash < (int)countof(FixedHash))
					{
						entry = &FixedHash[NumFixedHash];
						entry->Next = Buckets[hash];
						Buckets[hash] = NumFixedHash++;
					}
					else
					{
						if (DynHash.Size() == 0)
						{
							DynHash.Grow(50);
						}
						i = DynHash.Reserve(1);
						entry = &DynHash[i];
						entry->Next = Buckets[hash];
						Buckets[hash] = i + countof(FixedHash);
					}
					entry->Actor = me;
					return me;
				}
			}
		}

		if (++curx > maxx)
		{
			curx = minx;
			if (++cury > maxy) return NULL;
		}
		StartBlock(curx, cury);
	}
}